

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

TypePointer * __thiscall
TypeFactory::getTypePointerNoDepth(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  type_metatype tVar1;
  int4 iVar2;
  int4 iVar3;
  Datatype *this_00;
  TypePointer *pTVar4;
  type_metatype meta;
  Datatype *basetype;
  Datatype *pDStack_28;
  uint4 ws_local;
  Datatype *pt_local;
  int4 s_local;
  TypeFactory *this_local;
  
  tVar1 = Datatype::getMetatype(pt);
  pDStack_28 = pt;
  if (tVar1 == TYPE_PTR) {
    this_00 = TypePointer::getPtrTo((TypePointer *)pt);
    tVar1 = Datatype::getMetatype(this_00);
    if (tVar1 == TYPE_PTR) {
      return (TypePointer *)pt;
    }
    if (tVar1 == TYPE_UNKNOWN) {
      iVar2 = Datatype::getSize(this_00);
      iVar3 = Datatype::getSize(pt);
      if (iVar2 == iVar3) {
        return (TypePointer *)pt;
      }
      iVar2 = Datatype::getSize(pt);
      pDStack_28 = getBase(this,iVar2,TYPE_UNKNOWN);
    }
  }
  pTVar4 = getTypePointer(this,s,pDStack_28,ws);
  return pTVar4;
}

Assistant:

TypePointer *TypeFactory::getTypePointerNoDepth(int4 s,Datatype *pt,uint4 ws)

{
  if (pt->getMetatype()==TYPE_PTR) {
    Datatype *basetype = ((TypePointer *)pt)->getPtrTo();
    type_metatype meta = basetype->getMetatype();
    // Make sure that at least we return a pointer to something the size of -pt-
    if (meta == TYPE_PTR)
      return (TypePointer *)pt;
    else if (meta == TYPE_UNKNOWN) {
      if (basetype->getSize() == pt->getSize())	// If -pt- is pointer to UNKNOWN of the size of a pointer
	return (TypePointer *)pt; // Just return pt, don't add another pointer
      pt = getBase(pt->getSize(),TYPE_UNKNOWN);	// Otherwise construct pointer to UNKNOWN of size of pointer
    }
  }
  return getTypePointer(s,pt,ws);
}